

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O1

void __thiscall Controller::Controller(Controller *this)

{
  _Head_base<0UL,_Board_*,_false> __ptr_00;
  _Head_base<0UL,_Board_*,_false> this_00;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  pointer *__ptr_1;
  pointer *__ptr;
  pointer __p;
  _Head_base<0UL,_UndoMove_*,_false> local_28;
  
  (this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
  super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.super__Head_base<0UL,_Board_*,_false>
  ._M_head_impl = (Board *)0x0;
  (this->imageProvider)._M_t.
  super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
  super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
  super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl = (ImageProvider *)0x0;
  (this->undoMoveService)._M_t.super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
  super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
  super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl = (UndoMove *)0x0;
  this_00._M_head_impl = (Board *)operator_new(0x38);
  Board::Board(this_00._M_head_impl,FOUR,NUMERIC);
  local_28._M_head_impl = (UndoMove *)0x0;
  __ptr_00._M_head_impl =
       (this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
       super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
       super__Head_base<0UL,_Board_*,_false>._M_head_impl;
  (this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
  super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.super__Head_base<0UL,_Board_*,_false>
  ._M_head_impl = this_00._M_head_impl;
  if (__ptr_00._M_head_impl != (Board *)0x0) {
    std::default_delete<Board>::operator()((default_delete<Board> *)this,__ptr_00._M_head_impl);
  }
  if ((Board *)local_28._M_head_impl != (Board *)0x0) {
    std::default_delete<Board>::operator()
              ((default_delete<Board> *)&local_28,(Board *)local_28._M_head_impl);
  }
  this_01 = (_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)operator_new(0x50);
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(this_01,0);
  local_28._M_head_impl = (UndoMove *)0x0;
  std::__uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>::reset
            ((__uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_> *)&this->undoMoveService,
             (pointer)this_01);
  std::unique_ptr<UndoMove,_std::default_delete<UndoMove>_>::~unique_ptr
            ((unique_ptr<UndoMove,_std::default_delete<UndoMove>_> *)&local_28);
  return;
}

Assistant:

Controller::Controller() 
{
    board = std::make_unique<Board>( BoardSize::FOUR, BoardMode::NUMERIC );
    undoMoveService = std::make_unique<UndoMove>();
}